

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O0

bool __thiscall lzham::symbol_codec::stop_encoding(symbol_codec *this,bool support_arith)

{
  bool bVar1;
  byte in_SIL;
  long in_RDI;
  undefined7 in_stack_ffffffffffffffe8;
  bool local_1;
  
  if (((in_SIL & 1) == 0) ||
     (bVar1 = arith_stop_encoding((symbol_codec *)
                                  (CONCAT17(in_SIL,in_stack_ffffffffffffffe8) & 0x1ffffffffffffff)),
     bVar1)) {
    bVar1 = assemble_output_buf(this);
    if (bVar1) {
      *(undefined4 *)(in_RDI + 0xc4) = 0;
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool symbol_codec::stop_encoding(bool support_arith)
   {
      LZHAM_ASSERT(m_mode == cEncoding);

      if (support_arith)
      {
         if (!arith_stop_encoding())
            return false;
      }

      if (!assemble_output_buf())
         return false;

      m_mode = cNull;
      return true;
   }